

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O3

void __thiscall
delta_complex_cell_t::delta_complex_cell_t
          (delta_complex_cell_t *this,vector<long,_std::allocator<long>_> *_vertices,
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          *_orientation,value_t _filt,index_t _loc)

{
  _Rb_tree_header *p_Var1;
  
  (this->boundary).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->boundary).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->coboundary).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->boundary).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->coboundary).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->coboundary).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  std::vector<long,_std::allocator<long>_>::vector(&this->vertices,_vertices);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector(&this->orientation,_orientation);
  this->location = _loc;
  this->cli_loc = -1;
  this->filt = _filt;
  this->oldest_coface = -1;
  p_Var1 = &(this->neighbours)._M_t._M_impl.super__Rb_tree_header;
  (this->neighbours)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->neighbours)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->neighbours)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->neighbours)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->neighbours)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->in_or_out)._M_h._M_buckets = &(this->in_or_out)._M_h._M_single_bucket;
  (this->in_or_out)._M_h._M_bucket_count = 1;
  (this->in_or_out)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->in_or_out)._M_h._M_element_count = 0;
  (this->in_or_out)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->in_or_out)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->in_or_out)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

delta_complex_cell_t(std::vector<index_t> _vertices, std::vector<std::vector<index_t>> _orientation, value_t _filt, index_t _loc) : filt(_filt),
                        oldest_coface(-1), orientation(_orientation), vertices(_vertices), location(_loc), cli_loc(-1) {}